

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<unsigned_long,_int,_8>::Addition
               (unsigned_long *lhs,int *rhs,unsigned_long *result)

{
  uint32_t uVar1;
  ulong *in_RDX;
  int *in_RSI;
  ulong *in_RDI;
  uint64_t tmp;
  
  if (*in_RSI < 0) {
    uVar1 = AbsValueHelper<int,_0>::Abs(0);
    if ((ulong)uVar1 <= *in_RDI) {
      *in_RDX = *in_RDI - (ulong)uVar1;
      return true;
    }
  }
  else if (*in_RDI <= *in_RDI + (long)*in_RSI) {
    *in_RDX = *in_RDI + (long)*in_RSI;
    return true;
  }
  return false;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is std::uint64_t, rhs signed
        std::uint64_t tmp = 0;

        if( rhs < 0 )
        {
            // So we're effectively subtracting
            tmp = AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if( tmp <= lhs )
            {
                result = lhs - tmp;
                return true;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // We added and it did not become smaller
            if( tmp >= lhs )
            {
                result = (T)tmp;
                return true;
            }
        }

        return false;
    }